

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

JoinerInfo * __thiscall
ot::commissioner::CommissionerApp::GetJoinerInfo
          (CommissionerApp *this,JoinerType aType,ByteArray *aJoinerId)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  JoinerInfo *pJVar3;
  key_type local_40;
  
  local_40.mType = aType;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_40.mId,aJoinerId);
  iVar1 = std::
          _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
          ::find(&(this->mJoiners)._M_t,&local_40);
  if (local_40.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  p_Var2 = &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    local_40.mType = aType;
    Commissioner::ComputeJoinerId(&local_40.mId,0);
    iVar1 = std::
            _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::find(&(this->mJoiners)._M_t,&local_40);
    if (local_40.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pJVar3 = (JoinerInfo *)0x0;
    if ((_Rb_tree_header *)iVar1._M_node != p_Var2) {
      pJVar3 = (JoinerInfo *)(iVar1._M_node + 2);
    }
  }
  else {
    pJVar3 = (JoinerInfo *)(iVar1._M_node + 2);
  }
  return pJVar3;
}

Assistant:

const JoinerInfo *CommissionerApp::GetJoinerInfo(JoinerType aType, const ByteArray &aJoinerId)
{
    auto joinerInfo = mJoiners.find({aType, aJoinerId});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    joinerInfo = mJoiners.find({aType, Commissioner::ComputeJoinerId(0)});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    return nullptr;
}